

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  ostream *poVar2;
  int iVar3;
  Code colour;
  string *this_00;
  string local_a0;
  allocator local_79;
  Colour colourGuard;
  AssertionPrinter printer;
  
  iVar3 = (*(((this->super_StreamingReporterBase<Catch::CompactReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  printer.printInfoMessages = true;
  if (((char)iVar3 == '\0') &&
     (((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar1 & FailureBit) == Ok ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
      (printer.printInfoMessages = false, OVar1 != Warning)))) {
    return false;
  }
  printer.result = &_assertionStats->assertionResult;
  printer.stream = (this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&printer.messages,&_assertionStats->infoMessages);
  printer.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  colourGuard.m_moved = false;
  colour = FileName;
  Colour::use(FileName);
  poVar2 = printer.stream;
  local_a0._M_dataplus._M_p = ((printer.result)->m_info).lineInfo.file;
  local_a0._M_string_length = ((printer.result)->m_info).lineInfo.line;
  Catch::operator<<(printer.stream,(SourceLineInfo *)&local_a0);
  std::operator<<(poVar2,':');
  Colour::~Colour(&colourGuard);
  printer.itMessage._M_current =
       printer.messages.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  OVar1 = ((printer.result)->m_resultData).resultType;
  switch(OVar1) {
  case Ok:
    std::__cxx11::string::string((string *)&local_a0,"passed",(allocator *)&colourGuard);
    anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightGreen,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    anon_unknown_1::AssertionPrinter::printOriginalExpression(&printer);
    anon_unknown_1::AssertionPrinter::printReconstructedExpression(&printer);
    colour = FileName;
    if (((printer.result)->m_info).capturedExpression.m_size == 0) {
      colour = None;
    }
    goto LAB_00124d11;
  case Info:
    std::__cxx11::string::string((string *)&local_a0,"info",(allocator *)&colourGuard);
    anon_unknown_1::AssertionPrinter::printResultType(&printer,None,&local_a0);
    break;
  case Warning:
    std::__cxx11::string::string((string *)&local_a0,"warning",(allocator *)&colourGuard);
    anon_unknown_1::AssertionPrinter::printResultType(&printer,None,&local_a0);
    break;
  case Unknown:
switchD_00124a32_caseD_ffffffff:
    std::__cxx11::string::string
              ((string *)&local_a0,"** internal error **",(allocator *)&colourGuard);
    anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    goto LAB_00124d1d;
  default:
    if (OVar1 == FailureBit) goto switchD_00124a32_caseD_ffffffff;
    if (OVar1 == ExpressionFailed) {
      if ((((printer.result)->m_info).resultDisposition & SuppressFail) == 0) {
        std::__cxx11::string::string((string *)&local_a0,"failed",(allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_a0);
        this_00 = &local_a0;
      }
      else {
        std::__cxx11::string::string((string *)&colourGuard," - but was ok",&local_79);
        std::operator+(&local_a0,"failed",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &colourGuard);
        anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightGreen,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        this_00 = (string *)&colourGuard;
      }
      std::__cxx11::string::~string((string *)this_00);
      anon_unknown_1::AssertionPrinter::printOriginalExpression(&printer);
      anon_unknown_1::AssertionPrinter::printReconstructedExpression(&printer);
    }
    else if (OVar1 == ExplicitFailure) {
      std::__cxx11::string::string((string *)&local_a0,"failed",(allocator *)&colourGuard);
      anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::string((string *)&local_a0,"explicitly",(allocator *)&colourGuard);
      anon_unknown_1::AssertionPrinter::printIssue(&printer,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      colour = None;
    }
    else {
      if (OVar1 == Exception) goto switchD_00124a32_caseD_ffffffff;
      if (OVar1 == ThrewException) {
        std::__cxx11::string::string((string *)&local_a0,"failed",(allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::string
                  ((string *)&local_a0,"unexpected exception with message:",
                   (allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printIssue(&printer,&local_a0);
LAB_00124bf0:
        std::__cxx11::string::~string((string *)&local_a0);
        anon_unknown_1::AssertionPrinter::printMessage(&printer);
      }
      else {
        if (OVar1 != DidntThrowException) {
          if (OVar1 != FatalErrorCondition) goto LAB_00124d1d;
          std::__cxx11::string::string((string *)&local_a0,"failed",(allocator *)&colourGuard);
          anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::string
                    ((string *)&local_a0,"fatal error condition with message:",
                     (allocator *)&colourGuard);
          anon_unknown_1::AssertionPrinter::printIssue(&printer,&local_a0);
          goto LAB_00124bf0;
        }
        std::__cxx11::string::string((string *)&local_a0,"failed",(allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::string
                  ((string *)&local_a0,"expected exception, got none",(allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printIssue(&printer,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      anon_unknown_1::AssertionPrinter::printExpressionWas(&printer);
    }
    goto LAB_00124d11;
  }
  std::__cxx11::string::~string((string *)&local_a0);
  anon_unknown_1::AssertionPrinter::printMessage(&printer);
LAB_00124d11:
  anon_unknown_1::AssertionPrinter::printRemainingMessages(&printer,colour);
LAB_00124d1d:
  std::endl<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase<Catch::CompactReporter>).stream);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&printer.messages);
  return true;
}

Assistant:

bool CompactReporter::assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning )
                    return false;
                printInfoMessages = false;
            }

            AssertionPrinter printer( stream, _assertionStats, printInfoMessages );
            printer.print();

            stream << std::endl;
            return true;
        }